

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::ResolveClips(LWOImporter *this)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  Logger *pLVar4;
  reference pvVar5;
  Clip *dest;
  Clip *clip;
  uint i;
  LWOImporter *this_local;
  
  for (clip._4_4_ = 0;
      sVar2 = std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::size
                        (&this->mClips), clip._4_4_ < sVar2; clip._4_4_ = clip._4_4_ + 1) {
    pvVar3 = std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::operator[]
                       (&this->mClips,(ulong)clip._4_4_);
    if (pvVar3->type == REF) {
      uVar1 = pvVar3->clipRef;
      sVar2 = std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::size
                        (&this->mClips);
      if (sVar2 <= uVar1) {
        pLVar4 = DefaultLogger::get();
        Logger::error(pLVar4,"LWO2: Clip referrer index is out of range");
        pvVar3->clipRef = 0;
      }
      pvVar5 = std::vector<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>::operator[]
                         (&this->mClips,(ulong)pvVar3->clipRef);
      if (pvVar5->type == REF) {
        pLVar4 = DefaultLogger::get();
        Logger::error(pLVar4,"LWO2: Clip references another clip reference");
        pvVar3->type = UNSUPPORTED;
      }
      else {
        std::__cxx11::string::operator=((string *)&pvVar3->path,(string *)&pvVar5->path);
        pvVar3->type = pvVar5->type;
      }
    }
  }
  return;
}

Assistant:

void LWOImporter::ResolveClips()
{
    for( unsigned int i = 0; i < mClips.size();++i) {

        Clip& clip = mClips[i];
        if (Clip::REF == clip.type) {

            if (clip.clipRef >= mClips.size())  {
                ASSIMP_LOG_ERROR("LWO2: Clip referrer index is out of range");
                clip.clipRef = 0;
            }

            Clip& dest = mClips[clip.clipRef];
            if (Clip::REF == dest.type) {
                ASSIMP_LOG_ERROR("LWO2: Clip references another clip reference");
                clip.type = Clip::UNSUPPORTED;
            }

            else    {
                clip.path = dest.path;
                clip.type = dest.type;
            }
        }
    }
}